

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CPhase<std::complex<double>_>::CPhase
          (CPhase<std::complex<double>_> *this,int control,int target,angle_type *angle,
          int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  
  target_local = target;
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00121bc0;
  std::
  make_unique<qclab::qgates::Phase<std::complex<double>>,int_const&,qclab::QAngle<double>const&>
            ((int *)&this->gate_,(QAngle<double> *)&target_local);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target_local) {
      if (target_local != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x32;
      goto LAB_00110920;
    }
    __assertion = "target >= 0";
  }
  __line = 0x31;
LAB_00110920:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/CPhase.hpp"
                ,__line,
                "qclab::qgates::CPhase<std::complex<double>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<double>]"
               );
}

Assistant:

CPhase( const int control , const int target , const angle_type& angle ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , angle ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }